

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threading_extensions.cpp
# Opt level: O1

bool density_tests::set_thread_priority(thread_priority i_priority)

{
  uint uVar1;
  int __inc;
  
  __inc = 0;
  if (i_priority < (critical|low)) {
    __inc = *(int *)(&DAT_00e9cee0 + (ulong)i_priority * 4);
  }
  uVar1 = nice(__inc);
  printf("nice() returned %d\n",(ulong)uVar1);
  return uVar1 != 0xffffffff;
}

Assistant:

bool set_thread_priority(thread_priority i_priority)
    {
        int priority = 0;
        switch (i_priority)
        {
        case density_tests::idle:
            priority = 19;
            break;
        case density_tests::low:
            priority = 10;
            break;
        case density_tests::normal:
            priority = 0;
            break;
        case density_tests::high:
            priority = -10;
            break;
        case density_tests::critical:
            priority = -20;
            break;
        default:
            break;
        }

        int result = nice(priority);
        printf("nice() returned %d\n", result);
        return result != -1;
    }